

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O2

string * __thiscall
FIX::Dictionary::getString
          (string *__return_storage_ptr__,Dictionary *this,string *key,bool capitalize)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  const_iterator cVar4;
  ConfigError *this_00;
  size_type sVar5;
  string local_50;
  
  string_toUpper(&local_50,key);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_data)._M_t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((_Rb_tree_header *)cVar4._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(cVar4._M_node + 2));
    if (capitalize) {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar2 = __return_storage_ptr__->_M_string_length;
      for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
        iVar3 = toupper((int)pcVar1[sVar5]);
        pcVar1[sVar5] = (char)iVar3;
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_50,key," not defined");
  ConfigError::ConfigError(this_00,&local_50);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

std::string Dictionary::getString( const std::string& key, bool capitalize ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  Data::const_iterator i = m_data.find(string_toUpper(key));
  if ( i == m_data.end() ) throw ConfigError( key + " not defined" );

  std::string result = i->second;
  if( capitalize )
     std::transform(result.begin(), result.end(), result.begin(), toupper);

  return result;
}